

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

char * param_type_as_str(ParamType type)

{
  if (type < (TYPED_PARAM_USIZE|TYPED_PARAM_BOOL)) {
    return &DAT_00112360 + *(int *)(&DAT_00112360 + (ulong)type * 4);
  }
  __assert_fail("!\"Invalid code path\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                ,0x9d,"const char *param_type_as_str(ParamType)");
}

Assistant:

const char *param_type_as_str(ParamType type) {
    switch (type) {
    case TYPED_PARAM_DOUBLE:
        return "DOUBLE";
    case TYPED_PARAM_FLOAT:
        return "FLOAT";
    case TYPED_PARAM_BOOL:
        return "BOOL";
    case TYPED_PARAM_INT32:
        return "INT32";
    case TYPED_PARAM_USIZE:
        return "USIZE";
    case TYPED_PARAM_STR:
        return "STR";
    }

    assert(!"Invalid code path");
    return "<UNKNOWN>";
}